

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_aggregate_expression.cpp
# Opt level: O2

Value * duckdb::NegatePercentileValue(Value *__return_storage_ptr__,Value *v,bool desc)

{
  PhysicalType PVar1;
  uint8_t width;
  uint8_t width_00;
  short value;
  int value_00;
  long value_01;
  BinderException *this;
  InternalException *this_00;
  uint8_t in_R9B;
  double dVar2;
  hugeint_t hVar3;
  hugeint_t value_02;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  allocator local_51;
  hugeint_t integral;
  string local_40;
  
  if (v->is_null != true) {
    dVar2 = Value::GetValue<double>(v);
    if ((dVar2 < 0.0) || (1.0 < dVar2)) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"PERCENTILEs can only take parameters in the range [0, 1]",
                 (allocator *)&integral);
      BinderException::BinderException(this,&local_40);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (desc) {
      if ((v->type_).id_ != DECIMAL) {
        dVar2 = Value::GetValue<double>(v);
        Value::DOUBLE(__return_storage_ptr__,-dVar2);
        return __return_storage_ptr__;
      }
      integral = IntegralValue::Get(v);
      width = DecimalType::GetWidth(&v->type_);
      width_00 = DecimalType::GetScale(&v->type_);
      PVar1 = (v->type_).physical_type_;
      if (PVar1 == INT128) {
        hVar3 = hugeint_t::operator-(&integral);
        value_02.lower = hVar3.upper;
        value_02.upper._0_1_ = width;
        value_02.upper._1_7_ = 0;
        Value::DECIMAL(__return_storage_ptr__,(Value *)hVar3.lower,value_02,width_00,in_R9B);
        return __return_storage_ptr__;
      }
      if (PVar1 == INT32) {
        hVar3 = hugeint_t::operator-(&integral);
        input_01.upper = hVar3.upper;
        input_01.lower = input_01.upper;
        value_00 = Cast::Operation<duckdb::hugeint_t,int>((Cast *)hVar3.lower,input_01);
        Value::DECIMAL(__return_storage_ptr__,value_00,width,width_00);
        return __return_storage_ptr__;
      }
      if (PVar1 != INT64) {
        if (PVar1 == INT16) {
          hVar3 = hugeint_t::operator-(&integral);
          input.upper = hVar3.upper;
          input.lower = input.upper;
          value = Cast::Operation<duckdb::hugeint_t,short>((Cast *)hVar3.lower,input);
          Value::DECIMAL(__return_storage_ptr__,value,width,width_00);
          return __return_storage_ptr__;
        }
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_40,"Unknown DECIMAL type",&local_51);
        InternalException::InternalException(this_00,&local_40);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      hVar3 = hugeint_t::operator-(&integral);
      input_00.upper = hVar3.upper;
      input_00.lower = input_00.upper;
      value_01 = Cast::Operation<duckdb::hugeint_t,long>((Cast *)hVar3.lower,input_00);
      Value::DECIMAL(__return_storage_ptr__,value_01,width,width_00);
      return __return_storage_ptr__;
    }
  }
  Value::Value(__return_storage_ptr__,v);
  return __return_storage_ptr__;
}

Assistant:

static Value NegatePercentileValue(const Value &v, const bool desc) {
	if (v.IsNull()) {
		return v;
	}

	const auto frac = v.GetValue<double>();
	if (frac < 0 || frac > 1) {
		throw BinderException("PERCENTILEs can only take parameters in the range [0, 1]");
	}

	if (!desc) {
		return v;
	}

	const auto &type = v.type();
	switch (type.id()) {
	case LogicalTypeId::DECIMAL: {
		// Negate DECIMALs as DECIMAL.
		const auto integral = IntegralValue::Get(v);
		const auto width = DecimalType::GetWidth(type);
		const auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(Cast::Operation<hugeint_t, int16_t>(-integral), width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(Cast::Operation<hugeint_t, int32_t>(-integral), width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(Cast::Operation<hugeint_t, int64_t>(-integral), width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(-integral, width, scale);
		default:
			throw InternalException("Unknown DECIMAL type");
		}
	}
	default:
		// Everything else can just be a DOUBLE
		return Value::DOUBLE(-v.GetValue<double>());
	}
}